

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

Aig_Man_t *
LivenessToSafetyTransformationOneStepLoop
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  uint uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *p0;
  int iVar9;
  int iVar10;
  int iVar11;
  Aig_Obj_t *local_40;
  
  if (p->nRegs == 0) {
    puts("The input AIG contains no register, returning the original AIG as it is");
    return p;
  }
  vecPis = Vec_PtrAlloc(p->nTruePis + 1);
  vecPiNames = Vec_PtrAlloc(p->nTruePis + 1);
  vecLos = Vec_PtrAlloc(vFair->nSize + p->nRegs * 2 + vLive->nSize + 1);
  vecLoNames = Vec_PtrAlloc(vFair->nSize + p->nRegs * 2 + vLive->nSize + 1);
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar2 = Abc_UtilStrsav("live2safe");
  p_00->pName = pcVar2;
  p_00->pSpec = (char *)0x0;
  pAVar3 = p->pConst1;
  pAVar3->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar9 = 0; iVar9 < p->nTruePis; iVar9 = iVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar9);
    pAVar4 = Aig_ObjCreateCi(p_00);
    (pAVar3->field_5).pData = pAVar4;
    Vec_PtrPush(vecPis,pAVar4);
    pAVar5 = Abc_NtkPi(pNtk,iVar9);
    pcVar2 = Abc_ObjName(pAVar5);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrPush(vecPiNames,pcVar2);
  }
  uVar1 = mode - 3;
  iVar9 = 0;
  if (uVar1 < 2) {
    local_40 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(vecPiNames,"SAVE_BIERE");
    iVar9 = 0;
  }
  else {
    local_40 = (Aig_Obj_t *)0x0;
  }
  for (; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar9);
    pAVar4 = Aig_ObjCreateCi(p_00);
    (pAVar3->field_5).pData = pAVar4;
    Vec_PtrPush(vecLos,pAVar4);
    pAVar5 = Abc_NtkCi(pNtk,pNtk->vPis->nSize + iVar9);
    pcVar2 = Abc_ObjName(pAVar5);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrPush(vecLoNames,pcVar2);
  }
  for (iVar9 = 0; iVar9 < p->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar9);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar6 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p_00,pAVar4,pAVar6);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  if ((mode == 4) || (mode == 1)) {
    iVar9 = vAssertSafety->nSize;
    if (iVar9 == 0) {
      puts("No safety property is specified, hence no safety gate is created");
    }
    else {
      if (vAssumeSafety->nSize == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
        for (iVar10 = 0; iVar10 < iVar9; iVar10 = iVar10 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar10);
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                   *(ulong *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar4 != (Aig_Obj_t *)0x0) {
            pAVar6 = Aig_And(p_00,pAVar6,pAVar4);
          }
          iVar9 = vAssertSafety->nSize;
          pAVar4 = pAVar6;
        }
        pAVar4 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
      }
      else {
        pAVar4 = (Aig_Obj_t *)0x0;
        for (iVar10 = 0; iVar10 < iVar9; iVar10 = iVar10 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,iVar10);
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                   *(ulong *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar4 != (Aig_Obj_t *)0x0) {
            pAVar6 = Aig_And(p_00,pAVar6,pAVar4);
          }
          iVar9 = vAssertSafety->nSize;
          pAVar4 = pAVar6;
        }
        pAVar6 = (Aig_Obj_t *)0x0;
        for (iVar9 = 0; iVar9 < vAssumeSafety->nSize; iVar9 = iVar9 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,iVar9);
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                   *(ulong *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar6 != (Aig_Obj_t *)0x0) {
            pAVar7 = Aig_And(p_00,pAVar7,pAVar6);
          }
          pAVar6 = pAVar7;
        }
        pAVar4 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar4 ^ 1),pAVar6);
      }
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  iVar9 = 0;
  if (uVar1 < 2) {
    pAVar3 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                   (((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28));
    iVar9 = 0;
  }
  else {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  for (; iVar10 = p->nRegs, iVar9 < iVar10; iVar9 = iVar9 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar9);
    pAVar4 = Saig_ObjLoToLi(p,pAVar4);
    Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                         ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                         *(ulong *)(((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) + 0x28)));
  }
  if (1 < uVar1) goto LAB_004bb1cc;
  pAVar4 = (Aig_Obj_t *)0x0;
  for (iVar11 = 0; iVar11 < iVar10; iVar11 = iVar11 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar11);
    pAVar7 = Saig_ObjLoToLi(p,pAVar6);
    pAVar6 = Aig_Exor(p_00,(Aig_Obj_t *)(pAVar6->field_5).pData,
                      (Aig_Obj_t *)
                      ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                      *(ulong *)(((ulong)pAVar7->pFanin0 & 0xfffffffffffffffe) + 0x28)));
    pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      pAVar6 = Aig_And(p_00,pAVar6,pAVar4);
    }
    iVar10 = p->nRegs;
    pAVar4 = pAVar6;
  }
  pAVar4 = Aig_And(p_00,local_40,pAVar4);
  if ((vLive == (Vec_Ptr_t *)0x0) || (iVar10 = vLive->nSize, iVar10 == 0)) {
    puts("Circuit without any liveness property");
LAB_004bb11d:
    pAVar6 = p_00->pConst1;
  }
  else {
    pAVar6 = (Aig_Obj_t *)0x0;
    for (iVar11 = 0; iVar11 < iVar10; iVar11 = iVar11 + 1) {
      pvVar8 = Vec_PtrEntry(vLive,iVar11);
      pAVar7 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^
               *(ulong *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x28));
      if (pAVar6 != (Aig_Obj_t *)0x0) {
        pAVar7 = Aig_And(p_00,pAVar7,pAVar6);
      }
      iVar10 = vLive->nSize;
      pAVar6 = pAVar7;
    }
    if (pAVar6 == (Aig_Obj_t *)0x0) goto LAB_004bb11d;
  }
  if ((vFair == (Vec_Ptr_t *)0x0) || (iVar10 = vFair->nSize, iVar10 == 0)) {
    puts("Circuit without any fairness property");
LAB_004bb192:
    pAVar7 = p_00->pConst1;
  }
  else {
    pAVar7 = (Aig_Obj_t *)0x0;
    for (iVar11 = 0; iVar11 < iVar10; iVar11 = iVar11 + 1) {
      pvVar8 = Vec_PtrEntry(vFair,iVar11);
      p0 = (Aig_Obj_t *)
           ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^
           *(ulong *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x28));
      if (pAVar7 != (Aig_Obj_t *)0x0) {
        p0 = Aig_And(p_00,p0,pAVar7);
      }
      iVar10 = vFair->nSize;
      pAVar7 = p0;
    }
    if (pAVar7 == (Aig_Obj_t *)0x0) goto LAB_004bb192;
  }
  pAVar6 = Aig_And(p_00,pAVar7,(Aig_Obj_t *)((ulong)pAVar6 ^ 1));
  pAVar4 = Aig_And(p_00,pAVar4,pAVar6);
  Aig_ObjPatchFanin0(p_00,pAVar3,pAVar4);
LAB_004bb1cc:
  Aig_ManSetRegNum(p_00,iVar9);
  Aig_ManCiCleanupBiere(p_00);
  Aig_ManCoCleanupBiere(p_00);
  Aig_ManCleanup(p_00);
  iVar9 = Aig_ManCheck(p_00);
  if (iVar9 != 0) {
    return p_00;
  }
  __assert_fail("Aig_ManCheck( pNew )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                ,0x470,
                "Aig_Man_t *LivenessToSafetyTransformationOneStepLoop(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationOneStepLoop( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
													  Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
	Aig_Man_t * pNew;
	int i, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc, *pObjAndAccDummy;
	Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
	Aig_Obj_t *pDriverImage;
	Aig_Obj_t *pObjCorrespondingLi;
	Aig_Obj_t *pArgument;
	Aig_Obj_t *collectiveAssertSafety, *collectiveAssumeSafety;

	char *nodeName;
	int piCopied = 0, liCopied = 0, loCopied = 0;//, liCreated = 0, loCreated = 0, piVecIndex = 0;

	if( Aig_ManRegNum( p ) == 0 )
	{
		printf("The input AIG contains no register, returning the original AIG as it is\n");
		return p;
	}

	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
	pNew->pName = Abc_UtilStrsav( "live2safe" );
    pNew->pSpec = NULL;
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

	//****************************************************************
    // Step 3: create true PIs
	//****************************************************************
    Saig_ManForEachPi( p, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecPis, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
		Vec_PtrPush( vecPiNames, nodeName );
	}

	//****************************************************************
	// Step 4: create the special Pi corresponding to SAVE
	//****************************************************************
	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSavePi = Aig_ObjCreateCi( pNew );
		nodeName = "SAVE_BIERE",
		Vec_PtrPush( vecPiNames, nodeName );
	}
			
	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecLos, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
		Vec_PtrPush( vecLoNames, nodeName );
    }

	//****************************************************************
	// Step 6: create "saved" register output
	//****************************************************************

#if 0
	loCreated++;
	pObjSavedLo = Aig_ObjCreateCi( pNew );
	Vec_PtrPush( vecLos, pObjSavedLo );
	nodeName = "SAVED_LO";
	Vec_PtrPush( vecLoNames, nodeName );
#endif

	//****************************************************************
	// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
	//****************************************************************
#if 0
	pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
	pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
#endif

	//********************************************************************
	// Step 8: create internal nodes
	//********************************************************************
    Aig_ManForEachNode( p, pObj, i )
	{
		pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

#if 0
	//********************************************************************
	// Step 8.x : create PO for each safety assertions
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
	}
#endif

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
	{
		if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
		}
		else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssertSafety = pObjAndAcc;
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssumeSafety = pObjAndAcc;
			Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
		}
		else
			printf("No safety property is specified, hence no safety gate is created\n");
	}

	//********************************************************************
	// Step 9: create the safety property output gate
	// create the safety property output gate, this will be the sole true PO 
	// of the whole circuit, discuss with Sat/Alan for an alternative implementation
	//********************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
	}

	// create register inputs for the original registers
    nRegCount = 0;
	
	Saig_ManForEachLo( p, pObj, i )
    {
		pMatch = Saig_ObjLoToLi( p, pObj );
        //Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
		Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
		liCopied++;
    }

#if 0
	// create register input corresponding to the register "saved"
	pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
	nRegCount++;
	liCreated++;7
#endif

	pObjAndAcc = NULL;

	//****************************************************************************************************
	//For detection of loop of length 1 we do not need any shadow register, we only need equality detector
	//between Lo_j and Li_j and then a cascade of AND gates
	//****************************************************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		Saig_ManForEachLo( p, pObj, i )
		{
			pObjCorrespondingLi = Saig_ObjLoToLi( p, pObj );
		
			pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData,  Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0( pObjCorrespondingLi )->pData, Aig_ObjFaninC0( pObjCorrespondingLi ) ) );
			pObjXnor = Aig_Not( pObjXor );
		
			if( pObjAndAcc == NULL )
				pObjAndAcc = pObjXnor;
			else
			{
				pObjAndAccDummy = pObjAndAcc;
				pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAccDummy );
			}
		}

		// create the AND gate whose output will be the signal "looped"
		pObjSavedLoAndEquality = Aig_And( pNew, pObjSavePi, pObjAndAcc );
	
		// create the master AND gate and corresponding AND and OR logic for the liveness properties
		pObjAndAcc = NULL;
		if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
			printf("Circuit without any liveness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjLive = pObjAndAcc;
		else
			pObjLive = Aig_ManConst1( pNew );
	
		// create the master AND gate and corresponding AND and OR logic for the fairness properties
		pObjAndAcc = NULL;
		if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
			printf("Circuit without any fairness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjFair = pObjAndAcc;
		else
			pObjFair = Aig_ManConst1( pNew );
	
		pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );
	
		Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
	}

	Aig_ManSetRegNum( pNew, nRegCount );

	//printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n", Vec_PtrSize( pNew->vPis ), pNew->nRegs );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );

	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	return pNew;
}